

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_test.cc
# Opt level: O3

void __thiscall
fizplex::SimplexTest_LowerRowLowerVarInfeasible_Test::TestBody
          (SimplexTest_LowerRowLowerVarInfeasible_Test *this)

{
  LP *this_00;
  bool bVar1;
  char *message;
  initializer_list<double> l;
  AssertionResult gtest_ar;
  Message local_50;
  AssertHelper local_48;
  double local_40;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  DVector local_30;
  
  this_00 = &(this->super_SimplexTest).lp;
  LP::add_column(this_00,LowerBound,1.0,INFINITY,2.0);
  local_40 = 1.0;
  l._M_len = 1;
  l._M_array = &local_40;
  DVector::DVector(&local_30,l);
  LP::add_row(this_00,LE,-INFINITY,0.0,&local_30);
  operator_delete(local_30.vals._M_data);
  SimplexTest::solve_lp(&this->super_SimplexTest);
  local_50.ss_.ptr_._0_4_ = 0;
  testing::internal::CmpHelperEQ<fizplex::Simplex::Result,fizplex::Simplex::Result>
            ((internal *)&local_40,"Simplex::Result::Infeasible","result",(Result *)&local_50,
             &(this->super_SimplexTest).result);
  if (local_40._0_1_ == (internal)0x0) {
    testing::Message::Message(&local_50);
    if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_38.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/simplex_test.cc"
               ,0x81,message);
    testing::internal::AssertHelper::operator=(&local_48,&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (CONCAT44(local_50.ss_.ptr_._4_4_,local_50.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_50.ss_.ptr_._4_4_,local_50.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_50.ss_.ptr_._4_4_,local_50.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(SimplexTest, LowerRowLowerVarInfeasible) {
  lp.add_column(ColType::LowerBound, 1.0, inf, 2);
  lp.add_row(RowType::LE, -inf, 0, {1});

  solve_lp();
  EXPECT_EQ(Simplex::Result::Infeasible, result);
}